

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBezierCurve,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcBSplineCurve *this;
  
  this = (IfcBSplineCurve *)operator_new(0xd8);
  *(undefined ***)&this->field_0xc0 = &PTR__Object_007e6a70;
  this[1].super_IfcBoundedCurve.super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  *(char **)&this[1].super_IfcBoundedCurve.super_IfcCurve.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8 =
       "IfcBezierCurve";
  Assimp::IFC::Schema_2x3::IfcBSplineCurve::IfcBSplineCurve
            (this,&PTR_construction_vtable_24__00851698);
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcBezierCurve_00851590;
  *(undefined ***)&this->field_0xc0 = &PTR__IfcBezierCurve_00851680;
  *(undefined ***)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcBezierCurve_008515b8;
  *(undefined ***)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcBezierCurve_008515e0;
  *(undefined ***)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcBezierCurve_00851608;
  *(undefined ***)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 =
       &PTR__IfcBezierCurve_00851630;
  *(undefined ***)&this->field_0xb0 = &PTR__IfcBezierCurve_00851658;
  GenericFill<Assimp::IFC::Schema_2x3::IfcBezierCurve>(db,params,(IfcBezierCurve *)this);
  return (Object *)
         ((long)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }